

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_add_http_header_by_name(lws *wsi,uchar *name,uchar *value,int length,uchar **p,uchar *end)

{
  uchar uVar1;
  uchar *puVar2;
  bool bVar3;
  uchar *end_local;
  uchar **p_local;
  int length_local;
  uchar *value_local;
  uchar *name_local;
  lws *wsi_local;
  
  if ((wsi->role_ops == &role_ops_h2) || ((wsi->wsistate & 0xf000000) == 0x1000000)) {
    wsi_local._4_4_ = lws_add_http2_header_by_name(wsi,name,value,length,p,end);
  }
  else {
    value_local = name;
    if (name != (uchar *)0x0) {
      while( true ) {
        bVar3 = false;
        if (*p < end) {
          bVar3 = *value_local != '\0';
        }
        if (!bVar3) break;
        uVar1 = *value_local;
        puVar2 = *p;
        *p = puVar2 + 1;
        *puVar2 = uVar1;
        value_local = value_local + 1;
      }
      if (*p == end) {
        return 1;
      }
      puVar2 = *p;
      *p = puVar2 + 1;
      *puVar2 = ' ';
    }
    if (*p + (long)length + 3 < end) {
      memcpy(*p,value,(long)length);
      *p = *p + length;
      puVar2 = *p;
      *p = puVar2 + 1;
      *puVar2 = '\r';
      puVar2 = *p;
      *p = puVar2 + 1;
      *puVar2 = '\n';
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_add_http_header_by_name(struct lws *wsi, const unsigned char *name,
			    const unsigned char *value, int length,
			    unsigned char **p, unsigned char *end)
{
#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi))
		return lws_add_http2_header_by_name(wsi, name,
						    value, length, p, end);
#else
	(void)wsi;
#endif
	if (name) {
		while (*p < end && *name)
			*((*p)++) = *name++;
		if (*p == end)
			return 1;
		*((*p)++) = ' ';
	}
	if (*p + length + 3 >= end)
		return 1;

	memcpy(*p, value, length);
	*p += length;
	*((*p)++) = '\x0d';
	*((*p)++) = '\x0a';

	return 0;
}